

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
::
~TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
          (TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
           *this)

{
  TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
  *this_local;
  
  ~TEST_MockReturnValueTest_LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongLongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    long long int ret_value = 1;
    long long int another_ret_value = 2;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    LONGLONGS_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(ret_value, mock().returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongLongIntValue());
    LONGLONGS_EQUAL(another_ret_value, mock().returnValue().getLongLongIntValue());
}